

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O3

int spki_table_copy_except_socket(spki_table *src,spki_table *dst,rtr_socket *socket)

{
  uint8_t *puVar1;
  rtr_socket *prVar2;
  int iVar3;
  long lVar4;
  tommy_list ptVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  long in_FS_OFFSET;
  byte bVar8;
  spki_record record;
  spki_record local_b8;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&src->lock);
  ptVar5 = src->list;
  iVar3 = 0;
  if (ptVar5 != (tommy_list)0x0) {
    do {
      puVar1 = (uint8_t *)ptVar5->data;
      local_b8.asn = *(uint32_t *)(puVar1 + 0x14);
      prVar2 = *(rtr_socket **)(puVar1 + 0x78);
      local_b8.ski._16_4_ = *(undefined4 *)(puVar1 + 0x10);
      local_b8.ski._0_8_ = *(undefined8 *)puVar1;
      local_b8.ski._8_8_ = *(undefined8 *)(puVar1 + 8);
      puVar6 = puVar1 + 0x18;
      puVar7 = local_b8.spki;
      local_b8.socket = prVar2;
      for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)puVar7 = *(undefined8 *)puVar6;
        puVar6 = puVar6 + (ulong)bVar8 * -0x10 + 8;
        puVar7 = puVar7 + ((ulong)bVar8 * -2 + 1) * 8;
      }
      local_b8.spki._88_2_ = *(undefined2 *)(puVar1 + 0x70);
      local_b8.spki[0x5a] = puVar1[0x72];
      if (prVar2 != socket) {
        iVar3 = spki_table_add_entry(dst,&local_b8);
        if (iVar3 != 0) {
          iVar3 = -1;
          goto LAB_0010cac8;
        }
      }
      ptVar5 = ptVar5->next;
    } while (ptVar5 != (tommy_node_struct *)0x0);
    iVar3 = 0;
  }
LAB_0010cac8:
  pthread_rwlock_unlock((pthread_rwlock_t *)&src->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_copy_except_socket(struct spki_table *src, struct spki_table *dst, struct rtr_socket *socket)
{
	tommy_node *current_node;
	int ret = SPKI_SUCCESS;

	pthread_rwlock_rdlock(&src->lock);
	current_node = tommy_list_head(&src->list);
	while (current_node) {
		struct key_entry *entry;
		struct spki_record record;

		entry = (struct key_entry *)current_node->data;
		key_entry_to_spki_record(entry, &record);

		if (entry->socket != socket) {
			if (spki_table_add_entry(dst, &record) != SPKI_SUCCESS) {
				ret = SPKI_ERROR;
				break;
			}
		}
		current_node = current_node->next;
	}

	pthread_rwlock_unlock(&src->lock);

	return ret;
}